

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fio.c
# Opt level: O0

intptr_t fio_listen(fio_listen_args args)

{
  fio_protocol_s *__dest;
  undefined1 auVar1 [48];
  int16_t iVar2;
  int iVar3;
  uintptr_t uVar4;
  int *piVar5;
  int64_t iVar6;
  long in_stack_00000008;
  code *local_d8;
  code *local_b8;
  undefined8 local_b0;
  undefined8 local_a8;
  code *local_a0;
  code *local_98;
  undefined8 local_90;
  fio_listen_protocol_s *local_88;
  void *local_80;
  void *local_70;
  _func_void_intptr_t_void_ptr *local_68;
  long local_60;
  _func_void_intptr_t_fio_protocol_s_ptr **local_58;
  char *local_50;
  size_t local_48;
  char *local_40;
  fio_protocol_s *local_38;
  fio_listen_protocol_s *pr;
  intptr_t uuid;
  char *tmp;
  size_t port_len;
  size_t addr_len;
  
  auVar1 = (undefined1  [48])args._0_48_;
  if ((in_stack_00000008 != 0) ||
     ((args.address != (char *)0x0 && (uVar4 = fio_tls_alpn_count(args.address), uVar4 != 0)))) {
    if ((args.port != (char *)0x0) || (args.on_open != (_func_void_intptr_t_void_ptr *)0x0)) {
      port_len = 0;
      tmp = (char *)0x0;
      if (args.port != (char *)0x0) {
        port_len = strlen(args.port);
      }
      if (args.on_open != (_func_void_intptr_t_void_ptr *)0x0) {
        tmp = (char *)strlen((char *)args.on_open);
        uuid = (intptr_t)args.on_open;
        iVar6 = fio_atol((char **)&uuid);
        args._0_48_ = auVar1;
        if (iVar6 == 0) {
          tmp = (char *)0x0;
          args.on_open = (_func_void_intptr_t_void_ptr *)0x0;
        }
        auVar1 = (undefined1  [48])args._0_48_;
        if (*(char *)uuid != '\0') {
          piVar5 = __errno_location();
          *piVar5 = 0x16;
          goto LAB_0010d62d;
        }
      }
      args._0_48_ = auVar1;
      pr = (fio_listen_protocol_s *)fio_socket(args.port,(char *)args.on_open,'\x01');
      if (pr != (fio_listen_protocol_s *)0xffffffffffffffff) {
        iVar3 = 0;
        if (tmp + port_len != (char *)0x0) {
          iVar3 = 2;
        }
        local_38 = (fio_protocol_s *)malloc((size_t)(tmp + (long)iVar3 + port_len + 0x80));
        if (local_38 != (fio_protocol_s *)0x0) {
          if (args.address == (char *)0x0) {
            local_d8 = fio_listen_on_data;
            __dest = local_38;
          }
          else {
            fio_tls_dup(args.address);
            __dest = local_38;
            uVar4 = fio_tls_alpn_count(args.address);
            local_d8 = fio_listen_on_data_tls;
            if (uVar4 != 0) {
              local_d8 = fio_listen_on_data_tls_alpn;
            }
          }
          local_b8 = local_d8;
          local_b0 = 0;
          local_a8 = 0;
          local_a0 = fio_listen_on_close;
          local_98 = mock_ping_eternal;
          local_90 = 0;
          local_88 = pr;
          local_80 = args.tls;
          local_70 = args.udata;
          local_68 = args.on_start;
          local_60 = (long)&local_38[2].ping + port_len + 1;
          local_58 = &local_38[2].ping;
          local_50 = tmp;
          local_48 = port_len;
          local_40 = args.address;
          memcpy(__dest,&local_b8,0x80);
          if (port_len != 0) {
            memcpy(local_38[2].on_data,args.port,port_len + 1);
          }
          if (tmp != (char *)0x0) {
            memcpy((void *)local_38[1].rsv,args.on_open,(size_t)(tmp + 1));
          }
          iVar2 = fio_is_running();
          if (iVar2 == 0) {
            fio_state_callback_add(FIO_CALL_ON_START,fio_listen_on_startup,local_38);
            fio_state_callback_add(FIO_CALL_ON_SHUTDOWN,fio_listen_cleanup_task,local_38);
          }
          else {
            fio_attach((intptr_t)local_38[1].on_data,local_38);
          }
          if (args.on_open == (_func_void_intptr_t_void_ptr *)0x0) {
            if (3 < FIO_LOG_LEVEL) {
              FIO_LOG2STDERR("INFO: Listening on Unix Socket at %s",args.port);
            }
          }
          else if (3 < FIO_LOG_LEVEL) {
            FIO_LOG2STDERR("INFO: Listening on port %s",args.on_open);
          }
          return (intptr_t)pr;
        }
        if (0 < FIO_LOG_LEVEL) {
          FIO_LOG2STDERR(
                        "FATAL: memory allocation error /workspace/llm4binary/github/license_all_cmakelists_1510/spujadas[P]rshutdown/facil/lib/facil/fio.c:4594"
                        );
        }
        kill(0,2);
        piVar5 = __errno_location();
        exit(*piVar5);
      }
      pr = (fio_listen_protocol_s *)0xffffffffffffffff;
      goto LAB_0010d62d;
    }
  }
  piVar5 = __errno_location();
  *piVar5 = 0x16;
LAB_0010d62d:
  if (args.on_start != (_func_void_intptr_t_void_ptr *)0x0) {
    (*args.on_start)(-1,args.tls);
  }
  return -1;
}

Assistant:

intptr_t fio_listen FIO_IGNORE_MACRO(struct fio_listen_args args) {
  // ...
  if ((!args.on_open && (!args.tls || !fio_tls_alpn_count(args.tls))) ||
      (!args.address && !args.port)) {
    errno = EINVAL;
    goto error;
  }

  size_t addr_len = 0;
  size_t port_len = 0;
  if (args.address)
    addr_len = strlen(args.address);
  if (args.port) {
    port_len = strlen(args.port);
    char *tmp = (char *)args.port;
    if (!fio_atol(&tmp)) {
      port_len = 0;
      args.port = NULL;
    }
    if (*tmp) {
      /* port format was invalid, should be only numerals */
      errno = EINVAL;
      goto error;
    }
  }
  const intptr_t uuid = fio_socket(args.address, args.port, 1);
  if (uuid == -1)
    goto error;

  fio_listen_protocol_s *pr = malloc(sizeof(*pr) + addr_len + port_len +
                                     ((addr_len + port_len) ? 2 : 0));
  FIO_ASSERT_ALLOC(pr);

  if (args.tls)
    fio_tls_dup(args.tls);

  *pr = (fio_listen_protocol_s){
      .pr =
          {
              .on_close = fio_listen_on_close,
              .ping = mock_ping_eternal,
              .on_data = (args.tls ? (fio_tls_alpn_count(args.tls)
                                          ? fio_listen_on_data_tls_alpn
                                          : fio_listen_on_data_tls)
                                   : fio_listen_on_data),
          },
      .uuid = uuid,
      .udata = args.udata,
      .on_open = args.on_open,
      .on_start = args.on_start,
      .on_finish = args.on_finish,
      .tls = args.tls,
      .addr_len = addr_len,
      .port_len = port_len,
      .addr = (char *)(pr + 1),
      .port = ((char *)(pr + 1) + addr_len + 1),
  };

  if (addr_len)
    memcpy(pr->addr, args.address, addr_len + 1);
  if (port_len)
    memcpy(pr->port, args.port, port_len + 1);

  if (fio_is_running()) {
    fio_attach(pr->uuid, &pr->pr);
  } else {
    fio_state_callback_add(FIO_CALL_ON_START, fio_listen_on_startup, pr);
    fio_state_callback_add(FIO_CALL_ON_SHUTDOWN, fio_listen_cleanup_task, pr);
  }

  if (args.port)
    FIO_LOG_INFO("Listening on port %s", args.port);
  else
    FIO_LOG_INFO("Listening on Unix Socket at %s", args.address);

  return uuid;
error:
  if (args.on_finish) {
    args.on_finish(-1, args.udata);
  }
  return -1;
}